

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGetPropertyCommand.cxx
# Opt level: O1

bool __thiscall
cmGetPropertyCommand::InitialPass
          (cmGetPropertyCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  string *name;
  string *name_00;
  OutType OVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  ostream *poVar5;
  cmState *pcVar6;
  cmPropertyDefinition *pcVar7;
  char *value;
  pointer pbVar8;
  string *psVar9;
  uint uVar10;
  ulong uVar11;
  ostringstream e;
  ScopeType local_1ec;
  string local_1d8;
  string *local_1b8;
  string *local_1b0;
  undefined1 local_1a8 [8];
  char *local_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [6];
  ios_base local_138 [264];
  
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
             (long)(args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start) < 0x41) {
    local_1a8 = (undefined1  [8])local_198;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"called with incorrect number of arguments","");
    cmCommand::SetError(&this->super_cmCommand,(string *)local_1a8);
  }
  else {
    name = &this->Variable;
    std::__cxx11::string::_M_assign((string *)name);
    iVar3 = std::__cxx11::string::compare
                      ((char *)((args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + 1));
    if (iVar3 == 0) {
      local_1ec = GLOBAL;
    }
    else {
      iVar3 = std::__cxx11::string::compare
                        ((char *)((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + 1));
      if (iVar3 == 0) {
        local_1ec = DIRECTORY;
      }
      else {
        iVar3 = std::__cxx11::string::compare
                          ((char *)((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + 1));
        if (iVar3 == 0) {
          local_1ec = TARGET;
        }
        else {
          iVar3 = std::__cxx11::string::compare
                            ((char *)((args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + 1));
          if (iVar3 == 0) {
            local_1ec = SOURCE_FILE;
          }
          else {
            iVar3 = std::__cxx11::string::compare
                              ((char *)((args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start + 1));
            if (iVar3 == 0) {
              local_1ec = TEST;
            }
            else {
              iVar3 = std::__cxx11::string::compare
                                ((char *)((args->
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          )._M_impl.super__Vector_impl_data._M_start + 1));
              if (iVar3 == 0) {
                local_1ec = VARIABLE;
              }
              else {
                iVar3 = std::__cxx11::string::compare
                                  ((char *)((args->
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            )._M_impl.super__Vector_impl_data._M_start + 1));
                if (iVar3 == 0) {
                  local_1ec = CACHE;
                }
                else {
                  iVar3 = std::__cxx11::string::compare
                                    ((char *)((args->
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              )._M_impl.super__Vector_impl_data._M_start + 1));
                  if (iVar3 != 0) {
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,"given invalid scope ",0x14);
                    pbVar8 = (args->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start;
                    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                                       ((ostream *)local_1a8,pbVar8[1]._M_dataplus._M_p,
                                        pbVar8[1]._M_string_length);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar5,".  ",3);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar5,"Valid scopes are ",0x11);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar5,
                               "GLOBAL, DIRECTORY, TARGET, SOURCE, TEST, VARIABLE, CACHE, INSTALL.",
                               0x42);
                    std::__cxx11::stringbuf::str();
                    cmCommand::SetError(&this->super_cmCommand,&local_1d8);
LAB_002ed01a:
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
                      operator_delete(local_1d8._M_dataplus._M_p,
                                      local_1d8.field_2._M_allocated_capacity + 1);
                    }
                    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
                    std::ios_base::~ios_base(local_138);
                    return false;
                  }
                  local_1ec = INSTALL;
                }
              }
            }
          }
        }
      }
    }
    pbVar8 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if (0x40 < (ulong)((long)(args->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8)) {
      local_1b0 = (string *)&this->PropertyName;
      local_1b8 = (string *)&this->Name;
      iVar3 = 1;
      uVar11 = 2;
      uVar10 = 3;
      do {
        iVar4 = std::__cxx11::string::compare((char *)(pbVar8 + uVar11));
        if (iVar4 == 0) {
          iVar3 = 2;
        }
        else {
          iVar4 = std::__cxx11::string::compare
                            ((char *)((args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + uVar11));
          if (iVar4 == 0) {
            this->InfoType = OutBriefDoc;
          }
          else {
            iVar4 = std::__cxx11::string::compare
                              ((char *)((args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start + uVar11));
            if (iVar4 == 0) {
              this->InfoType = OutFullDoc;
            }
            else {
              iVar4 = std::__cxx11::string::compare
                                ((char *)((args->
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          )._M_impl.super__Vector_impl_data._M_start + uVar11));
              if (iVar4 == 0) {
                this->InfoType = OutSet;
              }
              else {
                iVar4 = std::__cxx11::string::compare
                                  ((char *)((args->
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            )._M_impl.super__Vector_impl_data._M_start + uVar11));
                if (iVar4 == 0) {
                  this->InfoType = OutDefined;
                }
                else {
                  psVar9 = local_1b0;
                  if ((iVar3 != 2) && (psVar9 = local_1b8, iVar3 != 1)) {
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,"given invalid argument \"",0x18);
                    pbVar8 = (args->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start;
                    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                                       ((ostream *)local_1a8,pbVar8[uVar11]._M_dataplus._M_p,
                                        pbVar8[uVar11]._M_string_length);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\".",2);
                    std::__cxx11::stringbuf::str();
                    cmCommand::SetError(&this->super_cmCommand,&local_1d8);
                    goto LAB_002ed01a;
                  }
                  std::__cxx11::string::_M_assign(psVar9);
                }
              }
            }
          }
          iVar3 = 0;
        }
        uVar11 = (ulong)uVar10;
        pbVar8 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        uVar10 = uVar10 + 1;
      } while (uVar11 < (ulong)((long)(args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8 >>
                               5));
    }
    if ((this->PropertyName)._M_string_length != 0) {
      name_00 = &this->PropertyName;
      OVar1 = this->InfoType;
      if (OVar1 == OutDefined) {
        pcVar6 = cmMakefile::GetState((this->super_cmCommand).Makefile);
        pcVar7 = cmState::GetPropertyDefinition(pcVar6,name_00,local_1ec);
        if (pcVar7 == (cmPropertyDefinition *)0x0) {
          value = "0";
        }
        else {
          value = "1";
        }
        cmMakefile::AddDefinition((this->super_cmCommand).Makefile,name,value);
      }
      else {
        if (OVar1 == OutFullDoc) {
          local_1a8 = (undefined1  [8])local_198;
          local_1a0 = (char *)0x0;
          local_198[0]._M_local_buf[0] = '\0';
          pcVar6 = cmMakefile::GetState((this->super_cmCommand).Makefile);
          pcVar7 = cmState::GetPropertyDefinition(pcVar6,name_00,local_1ec);
          if (pcVar7 == (cmPropertyDefinition *)0x0) {
            std::__cxx11::string::_M_replace((ulong)local_1a8,0,local_1a0,0x5819d2);
          }
          else {
            std::__cxx11::string::_M_assign((string *)local_1a8);
          }
          cmMakefile::AddDefinition((this->super_cmCommand).Makefile,name,(char *)local_1a8);
        }
        else {
          if (OVar1 != OutBriefDoc) {
            switch(local_1ec) {
            case TARGET:
              bVar2 = HandleTargetMode(this);
              return bVar2;
            case SOURCE_FILE:
              bVar2 = HandleSourceMode(this);
              return bVar2;
            case DIRECTORY:
              bVar2 = HandleDirectoryMode(this);
              return bVar2;
            case GLOBAL:
              bVar2 = HandleGlobalMode(this);
              return bVar2;
            case CACHE:
              bVar2 = HandleCacheMode(this);
              return bVar2;
            case TEST:
              bVar2 = HandleTestMode(this);
              return bVar2;
            case VARIABLE:
              bVar2 = HandleVariableMode(this);
              return bVar2;
            default:
              return true;
            case INSTALL:
              bVar2 = HandleInstallMode(this);
              return bVar2;
            }
          }
          local_1a8 = (undefined1  [8])local_198;
          local_1a0 = (char *)0x0;
          local_198[0]._M_local_buf[0] = '\0';
          pcVar6 = cmMakefile::GetState((this->super_cmCommand).Makefile);
          pcVar7 = cmState::GetPropertyDefinition(pcVar6,name_00,local_1ec);
          if (pcVar7 == (cmPropertyDefinition *)0x0) {
            std::__cxx11::string::_M_replace((ulong)local_1a8,0,local_1a0,0x5819d2);
          }
          else {
            std::__cxx11::string::_M_assign((string *)local_1a8);
          }
          cmMakefile::AddDefinition((this->super_cmCommand).Makefile,name,(char *)local_1a8);
        }
        if (local_1a8 != (undefined1  [8])local_198) {
          operator_delete((void *)local_1a8,
                          CONCAT71(local_198[0]._M_allocated_capacity._1_7_,
                                   local_198[0]._M_local_buf[0]) + 1);
        }
      }
      return true;
    }
    local_1a8 = (undefined1  [8])local_198;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"not given a PROPERTY <name> argument.","");
    cmCommand::SetError(&this->super_cmCommand,(string *)local_1a8);
  }
  if (local_1a8 != (undefined1  [8])local_198) {
    operator_delete((void *)local_1a8,
                    CONCAT71(local_198[0]._M_allocated_capacity._1_7_,local_198[0]._M_local_buf[0])
                    + 1);
  }
  return false;
}

Assistant:

bool cmGetPropertyCommand::InitialPass(std::vector<std::string> const& args,
                                       cmExecutionStatus&)
{
  if (args.size() < 3) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }

  // The cmake variable in which to store the result.
  this->Variable = args[0];

  // Get the scope from which to get the property.
  cmProperty::ScopeType scope;
  if (args[1] == "GLOBAL") {
    scope = cmProperty::GLOBAL;
  } else if (args[1] == "DIRECTORY") {
    scope = cmProperty::DIRECTORY;
  } else if (args[1] == "TARGET") {
    scope = cmProperty::TARGET;
  } else if (args[1] == "SOURCE") {
    scope = cmProperty::SOURCE_FILE;
  } else if (args[1] == "TEST") {
    scope = cmProperty::TEST;
  } else if (args[1] == "VARIABLE") {
    scope = cmProperty::VARIABLE;
  } else if (args[1] == "CACHE") {
    scope = cmProperty::CACHE;
  } else if (args[1] == "INSTALL") {
    scope = cmProperty::INSTALL;
  } else {
    std::ostringstream e;
    e << "given invalid scope " << args[1] << ".  "
      << "Valid scopes are "
      << "GLOBAL, DIRECTORY, TARGET, SOURCE, TEST, VARIABLE, CACHE, INSTALL.";
    this->SetError(e.str());
    return false;
  }

  // Parse remaining arguments.
  enum Doing
  {
    DoingNone,
    DoingName,
    DoingProperty,
    DoingType
  };
  Doing doing = DoingName;
  for (unsigned int i = 2; i < args.size(); ++i) {
    if (args[i] == "PROPERTY") {
      doing = DoingProperty;
    } else if (args[i] == "BRIEF_DOCS") {
      doing = DoingNone;
      this->InfoType = OutBriefDoc;
    } else if (args[i] == "FULL_DOCS") {
      doing = DoingNone;
      this->InfoType = OutFullDoc;
    } else if (args[i] == "SET") {
      doing = DoingNone;
      this->InfoType = OutSet;
    } else if (args[i] == "DEFINED") {
      doing = DoingNone;
      this->InfoType = OutDefined;
    } else if (doing == DoingName) {
      doing = DoingNone;
      this->Name = args[i];
    } else if (doing == DoingProperty) {
      doing = DoingNone;
      this->PropertyName = args[i];
    } else {
      std::ostringstream e;
      e << "given invalid argument \"" << args[i] << "\".";
      this->SetError(e.str());
      return false;
    }
  }

  // Make sure a property name was found.
  if (this->PropertyName.empty()) {
    this->SetError("not given a PROPERTY <name> argument.");
    return false;
  }

  // Compute requested output.
  if (this->InfoType == OutBriefDoc) {
    // Lookup brief documentation.
    std::string output;
    if (cmPropertyDefinition const* def =
          this->Makefile->GetState()->GetPropertyDefinition(this->PropertyName,
                                                            scope)) {
      output = def->GetShortDescription();
    } else {
      output = "NOTFOUND";
    }
    this->Makefile->AddDefinition(this->Variable, output.c_str());
  } else if (this->InfoType == OutFullDoc) {
    // Lookup full documentation.
    std::string output;
    if (cmPropertyDefinition const* def =
          this->Makefile->GetState()->GetPropertyDefinition(this->PropertyName,
                                                            scope)) {
      output = def->GetFullDescription();
    } else {
      output = "NOTFOUND";
    }
    this->Makefile->AddDefinition(this->Variable, output.c_str());
  } else if (this->InfoType == OutDefined) {
    // Lookup if the property is defined
    if (this->Makefile->GetState()->GetPropertyDefinition(this->PropertyName,
                                                          scope)) {
      this->Makefile->AddDefinition(this->Variable, "1");
    } else {
      this->Makefile->AddDefinition(this->Variable, "0");
    }
  } else {
    // Dispatch property getting.
    switch (scope) {
      case cmProperty::GLOBAL:
        return this->HandleGlobalMode();
      case cmProperty::DIRECTORY:
        return this->HandleDirectoryMode();
      case cmProperty::TARGET:
        return this->HandleTargetMode();
      case cmProperty::SOURCE_FILE:
        return this->HandleSourceMode();
      case cmProperty::TEST:
        return this->HandleTestMode();
      case cmProperty::VARIABLE:
        return this->HandleVariableMode();
      case cmProperty::CACHE:
        return this->HandleCacheMode();
      case cmProperty::INSTALL:
        return this->HandleInstallMode();

      case cmProperty::CACHED_VARIABLE:
        break; // should never happen
    }
  }

  return true;
}